

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

void writesf_free(t_writesf *x)

{
  int iVar1;
  void *local_18;
  void *threadrtn;
  t_writesf *x_local;
  
  threadrtn = x;
  pthread_mutex_lock((pthread_mutex_t *)&x->x_mutex);
  *(undefined4 *)((long)threadrtn + 0x268) = 3;
  pthread_cond_signal((pthread_cond_t *)((long)threadrtn + 0x310));
  while (*(int *)((long)threadrtn + 0x268) != 0) {
    pthread_cond_signal((pthread_cond_t *)((long)threadrtn + 0x310));
    pthread_cond_wait((pthread_cond_t *)((long)threadrtn + 0x340),
                      (pthread_mutex_t *)((long)threadrtn + 0x2e8));
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)threadrtn + 0x2e8));
  iVar1 = pthread_join(*(pthread_t *)((long)threadrtn + 0x370),&local_18);
  if (iVar1 != 0) {
    pd_error(threadrtn,"writesf_free: join failed");
  }
  pthread_cond_destroy((pthread_cond_t *)((long)threadrtn + 0x310));
  pthread_cond_destroy((pthread_cond_t *)((long)threadrtn + 0x340));
  pthread_mutex_destroy((pthread_mutex_t *)((long)threadrtn + 0x2e8));
  freebytes(*(void **)((long)threadrtn + 0x40),(long)*(int *)((long)threadrtn + 0x48));
  return;
}

Assistant:

static void writesf_free(t_writesf *x)
{
    void *threadrtn;
    pthread_mutex_lock(&x->x_mutex);
    x->x_requestcode = REQUEST_QUIT;
#ifdef DEBUG_SOUNDFILE_THREADS
    fprintf(stderr, "writesf~: stopping thread...\n");
#endif
    sfread_cond_signal(&x->x_requestcondition);
    while (x->x_requestcode != REQUEST_NOTHING)
    {
#ifdef DEBUG_SOUNDFILE_THREADS
        fprintf(stderr, "writesf~: signaling...\n");
#endif
        sfread_cond_signal(&x->x_requestcondition);
        sfread_cond_wait(&x->x_answercondition, &x->x_mutex);
    }
    pthread_mutex_unlock(&x->x_mutex);
    if (pthread_join(x->x_childthread, &threadrtn))
        pd_error(x, "writesf_free: join failed");
#ifdef DEBUG_SOUNDFILE_THREADS
    fprintf(stderr, "writesf~: ... done\n");
#endif

    pthread_cond_destroy(&x->x_requestcondition);
    pthread_cond_destroy(&x->x_answercondition);
    pthread_mutex_destroy(&x->x_mutex);
    freebytes(x->x_buf, x->x_bufsize);
}